

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

int t_pool_dispatch(t_pool *p,t_results_queue *q,_func_void_ptr_void_ptr *func,void *arg)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  t_pool_job *ptVar2;
  t_pool *ptVar3;
  
  ptVar2 = (t_pool_job *)malloc(0x30);
  if (ptVar2 == (t_pool_job *)0x0) {
    iVar1 = -1;
  }
  else {
    ptVar2->func = func;
    ptVar2->arg = arg;
    ptVar2->next = (t_pool_job *)0x0;
    ptVar2->p = p;
    ptVar2->q = q;
    if (q == (t_results_queue *)0x0) {
      ptVar2->serial = 0;
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&q->result_m);
      iVar1 = q->curr_serial;
      q->curr_serial = iVar1 + 1;
      ptVar2->serial = iVar1;
      q->pending = q->pending + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&q->result_m);
    }
    __mutex = &p->pool_m;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while (iVar1 = p->njobs, p->qsize <= iVar1) {
      pthread_cond_wait((pthread_cond_t *)&p->full_c,(pthread_mutex_t *)__mutex);
    }
    p->njobs = iVar1 + 1;
    ptVar3 = (t_pool *)p->tail;
    if ((t_pool *)p->tail == (t_pool *)0x0) {
      ptVar3 = p;
    }
    ptVar3->head = ptVar2;
    p->tail = ptVar2;
    if ((-1 < (long)p->t_stack_top) && (p->tsize - p->nwaiting <= iVar1)) {
      pthread_cond_signal((pthread_cond_t *)&p->t[p->t_stack_top].pending_c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int t_pool_dispatch(t_pool *p, t_results_queue *q,
		    void *(*func)(void *arg), void *arg) {
    t_pool_job *j = malloc(sizeof(*j));

    if (!j)
	return -1;
    j->func = func;
    j->arg = arg;
    j->next = NULL;
    j->p = p;
    j->q = q;
    if (q) {
	pthread_mutex_lock(&q->result_m);
	j->serial = q->curr_serial++;
	q->pending++;
	pthread_mutex_unlock(&q->result_m);
    } else {
	j->serial = 0;
    }

#ifdef DEBUG
    fprintf(stderr, "Dispatching job %p for queue %p, serial %d\n", j, q, j->serial);
#endif

    pthread_mutex_lock(&p->pool_m);

    // Check if queue is full
    while (p->njobs >= p->qsize)
	pthread_cond_wait(&p->full_c, &p->pool_m);

    p->njobs++;

    if (p->tail) {
	p->tail->next = j;
	p->tail = j;
    } else {
	p->head = p->tail = j;
    }

    // Let a worker know we have data.
#ifdef IN_ORDER
    if (p->t_stack_top >= 0 && p->njobs > p->tsize - p->nwaiting)
	pthread_cond_signal(&p->t[p->t_stack_top].pending_c);
#else
    pthread_cond_signal(&p->pending_c);
#endif
    pthread_mutex_unlock(&p->pool_m);

#ifdef DEBUG
    fprintf(stderr, "Dispatched (serial %d)\n", j->serial);
#endif

    return 0;
}